

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O0

IMesh * __thiscall
irr::scene::CAnimatedMeshSceneNode::getMeshForCurrentFrame(CAnimatedMeshSceneNode *this)

{
  long *plVar1;
  int iVar2;
  u32 uVar3;
  IBoneSceneNode **ppIVar4;
  ISceneNode *pIVar5;
  ISceneNode *in_RDI;
  float extraout_XMM0_Da;
  f32 fVar6;
  u32 n;
  CSkinnedMesh *skinnedMesh;
  s32 frameBlend;
  s32 frameNr;
  array<irr::scene::IBoneSceneNode_*> *in_stack_00000058;
  CSkinnedMesh *in_stack_00000060;
  u32 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar7;
  uint local_24;
  IMesh *local_8;
  
  iVar2 = (**(code **)(**(long **)((long)&in_RDI[1].Name.
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._M_payload + 0x18) + 0x38))();
  if (iVar2 == 0xb) {
    local_8 = *(IMesh **)
               ((long)&in_RDI[1].Name.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x18);
    if (in_RDI[1].AbsoluteTransformation.M[6] == 2.8026e-45) {
      CSkinnedMesh::transferJointsToMesh
                (_frameBlend,(array<irr::scene::IBoneSceneNode_*> *)skinnedMesh);
    }
    else {
      (*in_RDI->_vptr_ISceneNode[0x2b])();
      (*local_8->_vptr_IMesh[0x14])();
    }
    (*local_8->_vptr_IMesh[0x15])();
    if (in_RDI[1].AbsoluteTransformation.M[6] == 1.4013e-45) {
      CSkinnedMesh::recoverJointsFromMesh(in_stack_00000060,in_stack_00000058);
      local_24 = 0;
      while (uVar7 = local_24,
            uVar3 = core::array<irr::scene::IBoneSceneNode_*>::size
                              ((array<irr::scene::IBoneSceneNode_*> *)0x2c70da), uVar7 < uVar3) {
        ppIVar4 = core::array<irr::scene::IBoneSceneNode_*>::operator[]
                            ((array<irr::scene::IBoneSceneNode_*> *)
                             CONCAT44(uVar7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
        pIVar5 = ISceneNode::getParent(&(*ppIVar4)->super_ISceneNode);
        if (pIVar5 == in_RDI) {
          ppIVar4 = core::array<irr::scene::IBoneSceneNode_*>::operator[]
                              ((array<irr::scene::IBoneSceneNode_*> *)
                               CONCAT44(uVar7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
          (*((*ppIVar4)->super_ISceneNode)._vptr_ISceneNode[0x29])();
        }
        local_24 = local_24 + 1;
      }
    }
    if (in_RDI[1].AbsoluteTransformation.M[6] == 2.8026e-45) {
      (*local_8->_vptr_IMesh[0x25])();
    }
  }
  else {
    (*in_RDI->_vptr_ISceneNode[0x2b])();
    (*in_RDI->_vptr_ISceneNode[0x2b])();
    fVar6 = core::fract(0.0);
    plVar1 = *(long **)((long)&in_RDI[1].Name.
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload + 0x18);
    local_8 = (IMesh *)(**(code **)(*plVar1 + 0x68))
                                 (plVar1,(int)extraout_XMM0_Da,(int)((float)fVar6 * 1000.0),
                                  *(undefined4 *)
                                   &in_RDI[1].Name.
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_engaged,
                                  *(undefined4 *)
                                   &in_RDI[1].Name.
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    .field_0x24);
  }
  return local_8;
}

Assistant:

IMesh *CAnimatedMeshSceneNode::getMeshForCurrentFrame()
{
	if (Mesh->getMeshType() != EAMT_SKINNED) {
		s32 frameNr = (s32)getFrameNr();
		s32 frameBlend = (s32)(core::fract(getFrameNr()) * 1000.f);
		return Mesh->getMesh(frameNr, frameBlend, StartFrame, EndFrame);
	} else {
		// As multiple scene nodes may be sharing the same skinned mesh, we have to
		// re-animate it every frame to ensure that this node gets the mesh that it needs.

		CSkinnedMesh *skinnedMesh = static_cast<CSkinnedMesh *>(Mesh);

		if (JointMode == EJUOR_CONTROL) // write to mesh
			skinnedMesh->transferJointsToMesh(JointChildSceneNodes);
		else
			skinnedMesh->animateMesh(getFrameNr(), 1.0f);

		// Update the skinned mesh for the current joint transforms.
		skinnedMesh->skinMesh();

		if (JointMode == EJUOR_READ) { // read from mesh
			skinnedMesh->recoverJointsFromMesh(JointChildSceneNodes);

			//---slow---
			for (u32 n = 0; n < JointChildSceneNodes.size(); ++n)
				if (JointChildSceneNodes[n]->getParent() == this) {
					JointChildSceneNodes[n]->updateAbsolutePositionOfAllChildren(); // temp, should be an option
				}
		}

		if (JointMode == EJUOR_CONTROL) {
			// For meshes other than EJUOR_CONTROL, this is done by calling animateMesh()
			skinnedMesh->updateBoundingBox();
		}

		return skinnedMesh;
	}
}